

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::h4(disp *this,string *s1,string *s2,string *s3,string *s4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  string local_108 [7];
  char in_stack_fffffffffffffeff;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [72];
  
  std::operator+(in_stack_fffffffffffffeff,in_stack_fffffffffffffef0);
  std::operator+(in_RCX,(char)((ulong)in_RDX >> 0x38));
  std::operator+(in_RCX,in_RDX);
  std::operator+(in_RCX,(char)((ulong)in_RDX >> 0x38));
  std::operator+(in_RCX,in_RDX);
  std::operator+(in_RCX,(char)((ulong)in_RDX >> 0x38));
  std::operator+(in_RCX,in_RDX);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  return;
}

Assistant:

void h4(std::string s1,std::string s2,std::string s3,std::string s4)
	{ v_ = ':'+s1+':'+s2+':'+s3+':'+s4; }